

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.h
# Opt level: O3

void __thiscall LinearScan::LinearScan(LinearScan *this,Func *func)

{
  this->func = func;
  this->currentBlockNumber = 0;
  (this->floatRegs).word = 0;
  this->numFloatRegs = 0;
  (this->activeRegs).word = 0;
  (this->int32Regs).word = 0;
  this->numInt32Regs = 0;
  (this->callerSavedRegs).word = 0;
  (this->calleeSavedRegs).word = 0;
  (this->tempRegs).word = 0;
  (this->instrUseRegs).word = 0;
  (this->secondChanceRegs).word = 0;
  (this->callSetupRegs).word = 0;
  this->activeLiveranges = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->intRegUsedCount = 0;
  this->floatRegUsedCount = 0;
  this->loopNest = 0;
  this->m_bailOutRecordCount = 0;
  this->curLoop = (Loop *)0x0;
  this->currentRegion = (Region *)0x0;
  this->globalBailOutRecordTables = (GlobalBailOutRecordDataTable **)0x0;
  this->lastUpdatedRowIndices = (uint **)0x0;
  LinearScanMD::LinearScanMD(&this->linearScanMD,func);
  *(undefined8 *)((long)&(this->opHelperBlockIter).current + 4) = 0;
  *(undefined8 *)((long)&this->currentOpHelperBlock + 4) = 0;
  (this->opHelperBlockIter).list =
       (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0;
  (this->opHelperBlockIter).current = (NodeBase *)0x0;
  (this->opHelperSpilledRegs).word = 0;
  this->opHelperSpilledLiveranges = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->lastLabel = (LabelInstr *)0x0;
  this->stackPackInUseLiveRanges = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->stackSlotsFreeList = (SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->currentBlock = (LoweredBasicBlock *)0x0;
  (this->nonAllocatableRegs).word = 0;
  GeneratorBailIn::GeneratorBailIn(&this->bailIn,func,this);
  return;
}

Assistant:

LinearScan(Func *func) : func(func), currentBlockNumber(0), loopNest(0), intRegUsedCount(0), floatRegUsedCount(0), activeLiveranges(NULL),
        linearScanMD(func), opHelperSpilledLiveranges(NULL), currentOpHelperBlock(NULL),
        lastLabel(NULL), numInt32Regs(0), numFloatRegs(0), stackPackInUseLiveRanges(NULL), stackSlotsFreeList(NULL),
        totalOpHelperFullVisitedLength(0), curLoop(NULL), currentBlock(nullptr), currentRegion(nullptr), m_bailOutRecordCount(0),
        globalBailOutRecordTables(nullptr), lastUpdatedRowIndices(nullptr), bailIn(GeneratorBailIn(func, this))
    {
    }